

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_node(lys_ypr_ctx_conflict *pctx,lysp_node *node)

{
  uint16_t *puVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  void *exts;
  lysp_node_augment *aug;
  lysp_node_grp *plVar6;
  lysp_node *plVar7;
  lysp_node_action *plVar8;
  lysp_ext_instance *plVar9;
  lysp_ext_instance *plVar10;
  ulong uVar11;
  lysp_ext_instance *plVar12;
  void *exts_00;
  char *pcVar13;
  char flag_00;
  lysp_node_leaf *leaf;
  lysp_ext_instance *in_R8;
  int8_t *flag_01;
  lysp_ext_instance *plVar14;
  ulong uVar15;
  uint64_t u;
  long lVar16;
  long lVar17;
  int8_t flag;
  int8_t flag_2;
  int8_t flag_1;
  int8_t local_49;
  int8_t local_48;
  int8_t local_47;
  int8_t local_46;
  int8_t local_45;
  int8_t local_44;
  int8_t local_43;
  int8_t local_42;
  int8_t local_41;
  lysp_node *local_40;
  lysp_ext_instance *local_38;
  
  uVar2 = node->nodetype;
  if (uVar2 < 0x20) {
    switch(uVar2) {
    case 1:
      local_48 = '\0';
      yprp_node_common1(pctx,node,&local_48);
      lVar16 = 0;
      plVar14 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[1].parent[-1].exts;
        }
        if (plVar9 <= plVar14) break;
        if (local_48 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_restr(pctx,(lysp_restr *)((long)&(node[1].parent)->parent + lVar16),LY_STMT_MUST,
                   "condition",(int8_t *)in_R8);
        plVar14 = (lysp_ext_instance *)((long)&plVar14->name + 1);
        lVar16 = lVar16 + 0x40;
      }
      if (node[1].next != (lysp_node *)0x0) {
        if (local_48 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        ypr_substmt(pctx,LY_STMT_PRESENCE,'\0',(char *)node[1].next,node->exts);
      }
      yprp_node_common2(pctx,node,&local_48);
      lVar16 = 0;
      uVar15 = 0;
      while( true ) {
        if (node[1].name == (char *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ulong *)(node[1].name + -8);
        }
        if (uVar11 <= uVar15) break;
        if (local_48 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_typedef(pctx,(lysp_tpdf *)(node[1].name + lVar16));
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 0xb0;
      }
      for (plVar6 = (lysp_node_grp *)node[1].dsc; plVar6 != (lysp_node_grp *)0x0;
          plVar6 = (plVar6->field_0).field_1.next) {
        if (local_48 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_grouping(pctx,plVar6);
      }
      for (plVar7 = (lysp_node *)node[1].ref; plVar7 != (lysp_node *)0x0; plVar7 = plVar7->next) {
        if (local_48 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_node(pctx,plVar7);
      }
      for (plVar8 = (lysp_node_action *)node[1].iffeatures; plVar8 != (lysp_node_action *)0x0;
          plVar8 = (plVar8->field_0).field_1.next) {
        if (local_48 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_action(pctx,plVar8);
      }
      flag_00 = local_48;
      for (plVar14 = node[1].exts; local_48 = flag_00, plVar14 != (lysp_ext_instance *)0x0;
          plVar14 = *(lysp_ext_instance **)&plVar14->format) {
        if (flag_00 == '\0') {
          local_48 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_notification(pctx,(lysp_node_notif *)plVar14);
        flag_00 = local_48;
      }
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "container";
      break;
    case 2:
      local_46 = '\0';
      yprp_node_common1(pctx,node,&local_46);
      if (node[1].next != (lysp_node *)0x0) {
        if (local_46 == '\0') {
          local_46 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)node[1].next,node->exts);
      }
      yprp_node_common2(pctx,node,&local_46);
      flag_00 = local_46;
      for (plVar7 = node[1].parent; local_46 = flag_00, plVar7 != (lysp_node *)0x0;
          plVar7 = plVar7->next) {
        if (flag_00 == '\0') {
          local_46 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_node(pctx,plVar7);
        flag_00 = local_46;
      }
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "choice";
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_001970c0_caseD_3;
    case 4:
      local_42 = '\x01';
      yprp_node_common1(pctx,node,&local_42);
      yprp_type(pctx,(lysp_type *)&node[1].next);
      plVar14 = node->exts;
      lVar16 = 0;
      ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)node[2].exts,plVar14);
      plVar9 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar7 = node[1].parent;
        if (plVar7 == (lysp_node *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar7[-1].exts;
        }
        if (plVar12 <= plVar9) break;
        yprp_restr(pctx,(lysp_restr *)((long)&plVar7->parent + lVar16),LY_STMT_MUST,"condition",
                   (int8_t *)plVar14);
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar16 = lVar16 + 0x40;
      }
      ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)node[3].parent,node->exts);
      yprp_node_common2(pctx,node,&local_42);
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "leaf";
      flag_00 = local_42;
      break;
    case 8:
      local_41 = '\x01';
      yprp_node_common1(pctx,node,&local_41);
      yprp_type(pctx,(lysp_type *)&node[1].next);
      plVar14 = node->exts;
      lVar16 = 0;
      ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)node[2].exts,plVar14);
      plVar9 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar7 = node[1].parent;
        if (plVar7 == (lysp_node *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar7[-1].exts;
        }
        if (plVar12 <= plVar9) break;
        yprp_restr(pctx,(lysp_restr *)((long)&plVar7->parent + lVar16),LY_STMT_MUST,"condition",
                   (int8_t *)plVar14);
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar16 = lVar16 + 0x40;
      }
      lVar16 = 0;
      plVar9 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar7 = node[3].parent;
        if (plVar7 == (lysp_node *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar7[-1].exts;
        }
        if (plVar12 <= plVar9) break;
        plVar14 = node->exts;
        ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)plVar9,*(char **)((long)&plVar7->parent + lVar16),
                    plVar14);
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar16 = lVar16 + 0x18;
      }
      if ((node->flags & 3) != 0) {
        plVar14 = node->exts;
        pcVar13 = "true";
        if ((node->flags & 1) == 0) {
          pcVar13 = "false";
        }
        ypr_substmt(pctx,LY_STMT_CONFIG,'\0',pcVar13,plVar14);
      }
      if ((node->flags & 0x200) != 0) {
        uVar3._0_2_ = node[3].nodetype;
        uVar3._2_2_ = node[3].flags;
        ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)node->exts,(void *)(ulong)uVar3,
                     (unsigned_long)plVar14);
      }
      if ((node->flags & 0x400) != 0) {
        plVar14 = node->exts;
        if ((void *)(ulong)*(uint *)&node[3].field_0xc == (void *)0x0) {
          ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",plVar14);
        }
        else {
          ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar14,
                       (void *)(ulong)*(uint *)&node[3].field_0xc,(unsigned_long)plVar14);
        }
      }
      if ((node->flags & 0xc0) != 0) {
        pcVar13 = "user";
        if ((node->flags & 0x40) == 0) {
          pcVar13 = "system";
        }
        ypr_substmt(pctx,LY_STMT_ORDERED_BY,'\0',pcVar13,node->exts);
      }
      ypr_status(pctx,node->flags,node->exts,&local_41);
      ypr_description(pctx,node->dsc,node->exts,&local_41);
      ypr_reference(pctx,node->ref,node->exts,&local_41);
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "leaf-list";
      flag_00 = local_41;
      break;
    default:
      if (uVar2 != 0x10) {
        return;
      }
      local_49 = '\0';
      yprp_node_common1(pctx,node,&local_49);
      lVar16 = 0;
      plVar14 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[1].parent[-1].exts;
        }
        if (plVar9 <= plVar14) break;
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_restr(pctx,(lysp_restr *)((long)&(node[1].parent)->parent + lVar16),LY_STMT_MUST,
                   "condition",(int8_t *)in_R8);
        plVar14 = (lysp_ext_instance *)((long)&plVar14->name + 1);
        lVar16 = lVar16 + 0x40;
      }
      if (node[1].next != (lysp_node *)0x0) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        in_R8 = node->exts;
        ypr_substmt(pctx,LY_STMT_KEY,'\0',(char *)node[1].next,in_R8);
      }
      lVar16 = 0;
      plVar14 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[2].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[2].parent[-1].exts;
        }
        if (plVar9 <= plVar14) break;
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        in_R8 = node->exts;
        ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar14,
                    *(char **)((long)&(node[2].parent)->parent + lVar16),in_R8);
        plVar14 = (lysp_ext_instance *)((long)&plVar14->name + 1);
        lVar16 = lVar16 + 0x18;
      }
      ypr_config(pctx,node->flags,node->exts,&local_49);
      if ((node->flags & 0x200) != 0) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        uVar4._0_2_ = node[2].nodetype;
        uVar4._2_2_ = node[2].flags;
        ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)node->exts,(void *)(ulong)uVar4,
                     (unsigned_long)in_R8);
      }
      if ((node->flags & 0x400) != 0) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        plVar14 = node->exts;
        if ((void *)(ulong)*(uint *)&node[2].field_0xc == (void *)0x0) {
          ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",plVar14);
        }
        else {
          ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar14,
                       (void *)(ulong)*(uint *)&node[2].field_0xc,(unsigned_long)plVar14);
        }
      }
      if ((node->flags & 0xc0) != 0) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        pcVar13 = "user";
        if ((node->flags & 0x40) == 0) {
          pcVar13 = "system";
        }
        ypr_substmt(pctx,LY_STMT_ORDERED_BY,'\0',pcVar13,node->exts);
      }
      ypr_status(pctx,node->flags,node->exts,&local_49);
      ypr_description(pctx,node->dsc,node->exts,&local_49);
      ypr_reference(pctx,node->ref,node->exts,&local_49);
      lVar16 = 0;
      uVar15 = 0;
      while( true ) {
        if (node[1].name == (char *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ulong *)(node[1].name + -8);
        }
        if (uVar11 <= uVar15) break;
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_typedef(pctx,(lysp_tpdf *)(node[1].name + lVar16));
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 0xb0;
      }
      for (plVar6 = (lysp_node_grp *)node[1].dsc; plVar6 != (lysp_node_grp *)0x0;
          plVar6 = (plVar6->field_0).field_1.next) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_grouping(pctx,plVar6);
      }
      for (plVar7 = (lysp_node *)node[1].ref; plVar7 != (lysp_node *)0x0; plVar7 = plVar7->next) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_node(pctx,plVar7);
      }
      for (plVar8 = (lysp_node_action *)node[1].iffeatures; plVar8 != (lysp_node_action *)0x0;
          plVar8 = (plVar8->field_0).field_1.next) {
        if (local_49 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_action(pctx,plVar8);
      }
      flag_00 = local_49;
      for (plVar14 = node[1].exts; local_49 = flag_00, plVar14 != (lysp_ext_instance *)0x0;
          plVar14 = *(lysp_ext_instance **)&plVar14->format) {
        if (flag_00 == '\0') {
          local_49 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_notification(pctx,(lysp_node_notif *)plVar14);
        flag_00 = local_49;
      }
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "list";
    }
  }
  else if (uVar2 < 0x80) {
    if ((uVar2 != 0x20) && (uVar2 != 0x60)) {
      return;
    }
    local_44 = '\0';
    yprp_node_common1(pctx,node,&local_44);
    lVar16 = 0;
    plVar14 = (lysp_ext_instance *)0x0;
    while( true ) {
      if (node[1].parent == (lysp_node *)0x0) {
        plVar9 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar9 = node[1].parent[-1].exts;
      }
      if (plVar9 <= plVar14) break;
      if (local_44 == '\0') {
        local_44 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      yprp_restr(pctx,(lysp_restr *)((long)&(node[1].parent)->parent + lVar16),LY_STMT_MUST,
                 "condition",(int8_t *)in_R8);
      plVar14 = (lysp_ext_instance *)((long)&plVar14->name + 1);
      lVar16 = lVar16 + 0x40;
    }
    yprp_node_common2(pctx,node,&local_44);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = lys_nodetype2str(node->nodetype);
    flag_00 = local_44;
  }
  else if (uVar2 == 0x80) {
    local_43 = '\0';
    yprp_node_common1(pctx,node,&local_43);
    yprp_node_common2(pctx,node,&local_43);
    flag_00 = local_43;
    for (plVar7 = node[1].parent; local_43 = flag_00, plVar7 != (lysp_node *)0x0;
        plVar7 = plVar7->next) {
      if (flag_00 == '\0') {
        local_43 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      yprp_node(pctx,plVar7);
      flag_00 = local_43;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = "case";
  }
  else {
    if (uVar2 != 0x800) {
      return;
    }
    local_45 = '\0';
    yprp_node_common1(pctx,node,&local_45);
    local_40 = node;
    yprp_node_common2(pctx,node,&local_45);
    plVar14 = (lysp_ext_instance *)0x0;
    while( true ) {
      if (local_40[1].parent == (lysp_node *)0x0) {
        plVar9 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar9 = local_40[1].parent[-1].exts;
      }
      if (plVar9 <= plVar14) break;
      if (local_45 == '\0') {
        local_45 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      plVar7 = local_40[1].parent;
      lVar16 = (long)plVar14 * 0x50;
      local_47 = '\0';
      flag_01 = (int8_t *)0x0;
      local_38 = plVar14;
      ypr_open(pctx,"refine","target-node",*(char **)((long)plVar7 + lVar16),'\0');
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 + 1;
      plVar14 = *(lysp_ext_instance **)((long)plVar7 + lVar16 + 0x40);
      plVar12 = (lysp_ext_instance *)0x0;
      plVar9 = plVar14;
      while( true ) {
        if (plVar14 == (lysp_ext_instance *)0x0) {
          plVar10 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar10 = plVar14[-1].exts;
        }
        if (plVar10 <= plVar12) break;
        flag_01 = &local_47;
        yprp_extension_instance(pctx,LY_STMT_REFINE,'\0',plVar9,&local_47);
        plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
        plVar9 = plVar9 + 1;
      }
      yprp_iffeatures(pctx,*(lysp_qname **)((long)plVar7 + lVar16 + 0x18),
                      *(lysp_ext_instance **)((long)plVar7 + lVar16 + 0x40),&local_47);
      lVar17 = 0;
      uVar15 = 0;
      while( true ) {
        lVar5 = *(long *)((long)plVar7 + lVar16 + 0x20);
        if (lVar5 == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ulong *)(lVar5 + -8);
        }
        if (uVar11 <= uVar15) break;
        if (local_47 == '\0') {
          local_47 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        yprp_restr(pctx,(lysp_restr *)(*(long *)((long)plVar7 + lVar16 + 0x20) + lVar17),
                   LY_STMT_MUST,"condition",flag_01);
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x40;
      }
      if (*(long *)((long)plVar7 + lVar16 + 0x28) != 0) {
        if (local_47 == '\0') {
          local_47 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        flag_01 = *(int8_t **)((long)plVar7 + lVar16 + 0x40);
        ypr_substmt(pctx,LY_STMT_PRESENCE,'\0',*(char **)((long)plVar7 + lVar16 + 0x28),flag_01);
      }
      lVar17 = 0;
      uVar15 = 0;
      while( true ) {
        lVar5 = *(long *)((long)plVar7 + lVar16 + 0x30);
        if (lVar5 == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ulong *)(lVar5 + -8);
        }
        if (uVar11 <= uVar15) break;
        if (local_47 == '\0') {
          local_47 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        flag_01 = *(int8_t **)((long)plVar7 + lVar16 + 0x40);
        ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar15,
                    *(char **)(*(long *)((long)plVar7 + lVar16 + 0x30) + lVar17),flag_01);
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x18;
      }
      ypr_config(pctx,*(uint16_t *)((long)plVar7 + lVar16 + 0x48),
                 *(void **)((long)plVar7 + lVar16 + 0x40),&local_47);
      ypr_mandatory(pctx,*(uint16_t *)((long)plVar7 + lVar16 + 0x48),
                    *(void **)((long)plVar7 + lVar16 + 0x40),&local_47);
      if ((*(byte *)((long)plVar7 + lVar16 + 0x49) & 2) != 0) {
        if (local_47 == '\0') {
          local_47 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,
                     (uint8_t)*(undefined8 *)((long)plVar7 + lVar16 + 0x40),
                     (void *)(ulong)*(uint *)((long)plVar7 + lVar16 + 0x38),(unsigned_long)flag_01);
      }
      if ((*(byte *)((long)plVar7 + lVar16 + 0x49) & 4) != 0) {
        if (local_47 == '\0') {
          local_47 = '\x01';
          ly_print_((pctx->field_0).field_0.out,">\n");
        }
        exts_00 = (void *)(ulong)*(uint *)((long)plVar7 + lVar16 + 0x3c);
        exts = *(void **)((long)plVar7 + lVar16 + 0x40);
        if (exts_00 == (void *)0x0) {
          ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",exts);
        }
        else {
          ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)exts,exts_00,(unsigned_long)exts);
        }
      }
      ypr_description(pctx,*(char **)((long)plVar7 + lVar16 + 8),
                      *(void **)((long)plVar7 + lVar16 + 0x40),&local_47);
      ypr_reference(pctx,*(char **)((long)plVar7 + lVar16 + 0x10),
                    *(void **)((long)plVar7 + lVar16 + 0x40),&local_47);
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      ypr_close(pctx,"refine",local_47);
      plVar14 = (lysp_ext_instance *)((long)&local_38->name + 1);
    }
    flag_00 = local_45;
    for (aug = *(lysp_node_augment **)&local_40[1].nodetype; local_45 = flag_00,
        aug != (lysp_node_augment *)0x0; aug = (aug->field_0).field_1.next) {
      if (flag_00 == '\0') {
        local_45 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      yprp_augment(pctx,aug);
      flag_00 = local_45;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = "uses";
  }
  ypr_close(pctx,pcVar13,flag_00);
switchD_001970c0_caseD_3:
  return;
}

Assistant:

static void
yprp_node(struct lys_ypr_ctx *pctx, const struct lysp_node *node)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
        yprp_container(pctx, node);
        break;
    case LYS_CHOICE:
        yprp_choice(pctx, node);
        break;
    case LYS_LEAF:
        yprp_leaf(pctx, node);
        break;
    case LYS_LEAFLIST:
        yprp_leaflist(pctx, node);
        break;
    case LYS_LIST:
        yprp_list(pctx, node);
        break;
    case LYS_USES:
        yprp_uses(pctx, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yprp_anydata(pctx, node);
        break;
    case LYS_CASE:
        yprp_case(pctx, node);
        break;
    default:
        break;
    }
}